

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  long in_RDI;
  ImVec4 clip_rect;
  ImDrawCmd *pcmd;
  int cmd_i;
  ImDrawIdx *idx_buffer_offset;
  ImDrawList *cmd_list;
  int n;
  ImVec2 pos;
  GLuint vao_handle;
  float ortho_projection [4] [4];
  float B;
  float T;
  float R;
  float L;
  GLenum last_clip_origin;
  bool clip_origin_lower_left;
  GLboolean last_enable_scissor_test;
  GLboolean last_enable_depth_test;
  GLboolean last_enable_cull_face;
  GLboolean last_enable_blend;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  GLint last_vertex_array;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  int fb_height;
  int fb_width;
  ImGuiIO *io;
  ImVec4 local_118;
  ImDrawCmd *local_108;
  int local_fc;
  long local_f8;
  ImDrawList *local_f0;
  undefined4 in_stack_ffffffffffffff18;
  int iVar1;
  undefined4 in_stack_ffffffffffffff1c;
  float fVar2;
  undefined4 in_stack_ffffffffffffff20;
  float fVar3;
  GLuint in_stack_ffffffffffffff24;
  GLuint GVar4;
  float local_d8 [6];
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  float local_a8;
  float local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  int local_7c;
  byte local_75;
  char local_74;
  char local_73;
  char local_72;
  char local_71;
  GLenum local_70;
  GLenum local_6c;
  GLenum local_68;
  GLenum local_64;
  GLenum local_60;
  GLenum local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38 [2];
  GLuint local_30;
  GLuint local_2c;
  GLuint local_28;
  undefined4 local_24;
  GLuint local_20;
  GLenum local_1c;
  int local_18;
  int local_14;
  ImGuiIO *local_10;
  long local_8;
  
  local_8 = in_RDI;
  local_10 = ImGui::GetIO();
  local_14 = (int)(*(float *)(local_8 + 0x24) * (local_10->DisplayFramebufferScale).x);
  local_18 = (int)(*(float *)(local_8 + 0x28) * (local_10->DisplayFramebufferScale).y);
  if ((0 < local_14) && (0 < local_18)) {
    ImDrawData::ScaleClipRects
              ((ImDrawData *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    glGetIntegerv(0x84e0,&local_1c);
    (*__glewActiveTexture)(0x84c0);
    glGetIntegerv(0x8b8d,&local_20);
    glGetIntegerv(0x8069,&local_24);
    glGetIntegerv(0x8919,&local_28);
    glGetIntegerv(0x8894,&local_2c);
    glGetIntegerv(0x85b5,&local_30);
    glGetIntegerv(0xb40,local_38);
    glGetIntegerv(0xba2,&local_48);
    glGetIntegerv(0xc10,&local_58);
    glGetIntegerv(0x80c9,&local_5c);
    glGetIntegerv(0x80c8,&local_60);
    glGetIntegerv(0x80cb,&local_64);
    glGetIntegerv(0x80ca,&local_68);
    glGetIntegerv(0x8009,&local_6c);
    glGetIntegerv(0x883d,&local_70);
    local_71 = glIsEnabled(0xbe2);
    local_72 = glIsEnabled(0xb44);
    local_73 = glIsEnabled(0xb71);
    local_74 = glIsEnabled(0xc11);
    local_75 = 1;
    local_7c = 0;
    glGetIntegerv(0x935c,&local_7c);
    if (local_7c == 0x8ca2) {
      local_75 = 0;
    }
    glEnable(0xbe2);
    (*__glewBlendEquation)(0x8006);
    glBlendFunc(0x302,0x303);
    glDisable(0xb44);
    glDisable(0xb71);
    glEnable(0xc11);
    glPolygonMode(0x408);
    glViewport(0,0,local_14,local_18);
    local_80 = *(float *)(local_8 + 0x1c);
    local_84 = *(float *)(local_8 + 0x1c) + *(float *)(local_8 + 0x24);
    local_88 = *(float *)(local_8 + 0x20);
    local_8c = *(float *)(local_8 + 0x20) + *(float *)(local_8 + 0x28);
    local_d8[0] = 2.0 / (local_84 - local_80);
    local_d8[1] = 0.0;
    local_d8[2] = 0.0;
    local_d8[3] = 0.0;
    local_d8[4] = 0.0;
    local_d8[5] = 2.0 / (local_88 - local_8c);
    local_c0 = 0;
    local_bc = 0;
    local_b8 = 0;
    local_b4 = 0;
    local_b0 = 0xbf800000;
    local_ac = 0;
    local_a8 = (local_84 + local_80) / (local_80 - local_84);
    local_a4 = (local_88 + local_8c) / (local_8c - local_88);
    local_a0 = 0;
    local_9c = 0x3f800000;
    (*__glewUseProgram)(g_ShaderHandle);
    (*__glewUniform1i)(g_AttribLocationTex,0);
    (*__glewUniformMatrix4fv)(g_AttribLocationProjMtx,1,'\0',local_d8);
    (*__glewBindSampler)(0,0);
    GVar4 = 0;
    (*__glewGenVertexArrays)(1,(GLuint *)&stack0xffffffffffffff24);
    (*__glewBindVertexArray)(GVar4);
    (*__glewBindBuffer)(0x8892,g_VboHandle);
    (*__glewEnableVertexAttribArray)(g_AttribLocationPosition);
    (*__glewEnableVertexAttribArray)(g_AttribLocationUV);
    (*__glewEnableVertexAttribArray)(g_AttribLocationColor);
    (*__glewVertexAttribPointer)(g_AttribLocationPosition,2,0x1406,'\0',0x14,(void *)0x0);
    (*__glewVertexAttribPointer)(g_AttribLocationUV,2,0x1406,'\0',0x14,(void *)0x8);
    (*__glewVertexAttribPointer)(g_AttribLocationColor,4,0x1401,'\x01',0x14,(void *)0x10);
    fVar2 = (float)*(undefined8 *)(local_8 + 0x1c);
    fVar3 = (float)((ulong)*(undefined8 *)(local_8 + 0x1c) >> 0x20);
    for (iVar1 = 0; iVar1 < *(int *)(local_8 + 0x10); iVar1 = iVar1 + 1) {
      local_f0 = *(ImDrawList **)(*(long *)(local_8 + 8) + (long)iVar1 * 8);
      local_f8 = 0;
      (*__glewBindBuffer)(0x8892,g_VboHandle);
      (*__glewBufferData)(0x8892,(long)(local_f0->VtxBuffer).Size * 0x14,(local_f0->VtxBuffer).Data,
                          0x88e0);
      (*__glewBindBuffer)(0x8893,g_ElementsHandle);
      (*__glewBufferData)(0x8893,(long)(local_f0->IdxBuffer).Size << 1,(local_f0->IdxBuffer).Data,
                          0x88e0);
      for (local_fc = 0; local_fc < (local_f0->CmdBuffer).Size; local_fc = local_fc + 1) {
        local_108 = ImVector<ImDrawCmd>::operator[](&local_f0->CmdBuffer,local_fc);
        if (local_108->UserCallback == (ImDrawCallback)0x0) {
          ImVec4::ImVec4(&local_118,(local_108->ClipRect).x - fVar2,(local_108->ClipRect).y - fVar3,
                         (local_108->ClipRect).z - fVar2,(local_108->ClipRect).w - fVar3);
          if ((((local_118.x < (float)local_14) && (local_118.y < (float)local_18)) &&
              (0.0 <= local_118.z)) && (0.0 <= local_118.w)) {
            if ((local_75 & 1) == 0) {
              glScissor((int)local_118.x,(int)local_118.y,(int)local_118.z,(int)local_118.w);
            }
            else {
              glScissor((int)local_118.x,(int)((float)local_18 - local_118.w),
                        (int)(local_118.z - local_118.x),(int)(local_118.w - local_118.y));
            }
            glBindTexture(0xde1,(ulong)local_108->TextureId & 0xffffffff);
            glDrawElements(4,local_108->ElemCount,0x1403,local_f8);
          }
        }
        else {
          (*local_108->UserCallback)(local_f0,local_108);
        }
        local_f8 = local_f8 + (ulong)local_108->ElemCount * 2;
      }
    }
    (*__glewDeleteVertexArrays)(1,(GLuint *)&stack0xffffffffffffff24);
    (*__glewUseProgram)(local_20);
    glBindTexture(0xde1,local_24);
    (*__glewBindSampler)(0,local_28);
    (*__glewActiveTexture)(local_1c);
    (*__glewBindVertexArray)(local_30);
    (*__glewBindBuffer)(0x8892,local_2c);
    (*__glewBlendEquationSeparate)(local_6c,local_70);
    (*__glewBlendFuncSeparate)(local_5c,local_60,local_64,local_68);
    if (local_71 == '\0') {
      glDisable(0xbe2);
    }
    else {
      glEnable(0xbe2);
    }
    if (local_72 == '\0') {
      glDisable(0xb44);
    }
    else {
      glEnable(0xb44);
    }
    if (local_73 == '\0') {
      glDisable(0xb71);
    }
    else {
      glEnable(0xb71);
    }
    if (local_74 == '\0') {
      glDisable(0xc11);
    }
    else {
      glEnable(0xc11);
    }
    glPolygonMode(0x408,local_38[0]);
    glViewport(local_48,local_44,local_40,local_3c);
    glScissor(local_58,local_54,local_50,local_4c);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    ImGuiIO& io = ImGui::GetIO();
    int fb_width = (int)(draw_data->DisplaySize.x * io.DisplayFramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * io.DisplayFramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;
    draw_data->ScaleClipRects(io.DisplayFramebufferScale);

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
    GLint last_vertex_array; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array);
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
    bool clip_origin_lower_left = true;
#ifdef GL_CLIP_ORIGIN
    GLenum last_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&last_clip_origin); // Support for GL 4.5's glClipControl(GL_UPPER_LEFT)
    if (last_clip_origin == GL_UPPER_LEFT)
        clip_origin_lower_left = false;
#endif

    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor enabled, polygon fill
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
#endif

    // Setup viewport, orthographic projection matrix
    // Our visible imgui space lies from draw_data->DisplayPos (top left) to draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayMin is typically (0,0) for single viewport apps.
    glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height);
    float L = draw_data->DisplayPos.x;
    float R = draw_data->DisplayPos.x + draw_data->DisplaySize.x;
    float T = draw_data->DisplayPos.y;
    float B = draw_data->DisplayPos.y + draw_data->DisplaySize.y;
    const float ortho_projection[4][4] =
    {
        { 2.0f/(R-L),   0.0f,         0.0f,   0.0f },
        { 0.0f,         2.0f/(T-B),   0.0f,   0.0f },
        { 0.0f,         0.0f,        -1.0f,   0.0f },
        { (R+L)/(L-R),  (T+B)/(B-T),  0.0f,   1.0f },
    };
    glUseProgram(g_ShaderHandle);
    glUniform1i(g_AttribLocationTex, 0);
    glUniformMatrix4fv(g_AttribLocationProjMtx, 1, GL_FALSE, &ortho_projection[0][0]);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, 0); // We use combined texture/sampler state. Applications using GL 3.3 may set that otherwise.
#endif
    // Recreate the VAO every time
    // (This is to easily allow multiple GL contexts. VAO are not shared among GL contexts, and we don't track creation/deletion of windows so we don't have an obvious key to use to cache them.)
    GLuint vao_handle = 0;
    glGenVertexArrays(1, &vao_handle);
    glBindVertexArray(vao_handle);
    glBindBuffer(GL_ARRAY_BUFFER, g_VboHandle);
    glEnableVertexAttribArray(g_AttribLocationPosition);
    glEnableVertexAttribArray(g_AttribLocationUV);
    glEnableVertexAttribArray(g_AttribLocationColor);
    glVertexAttribPointer(g_AttribLocationPosition, 2, GL_FLOAT, GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, pos));
    glVertexAttribPointer(g_AttribLocationUV, 2, GL_FLOAT, GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, uv));
    glVertexAttribPointer(g_AttribLocationColor, 4, GL_UNSIGNED_BYTE, GL_TRUE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, col));

    // Draw
    ImVec2 pos = draw_data->DisplayPos;
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawIdx* idx_buffer_offset = 0;

        glBindBuffer(GL_ARRAY_BUFFER, g_VboHandle);
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);

        glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, g_ElementsHandle);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                // User callback (registered via ImDrawList::AddCallback)
                pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                ImVec4 clip_rect = ImVec4(pcmd->ClipRect.x - pos.x, pcmd->ClipRect.y - pos.y, pcmd->ClipRect.z - pos.x, pcmd->ClipRect.w - pos.y);
                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    if (clip_origin_lower_left)
                        glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));
                    else
                        glScissor((int)clip_rect.x, (int)clip_rect.y, (int)clip_rect.z, (int)clip_rect.w); // Support for GL 4.5's glClipControl(GL_UPPER_LEFT)

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer_offset);
                }
            }
            idx_buffer_offset += pcmd->ElemCount;
        }
    }
    glDeleteVertexArrays(1, &vao_handle);

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
    glBindVertexArray(last_vertex_array);
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}